

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

void xmlRegisterDefaultInputCallbacks(void)

{
  long lVar1;
  
  if (xmlInputCallbackInitialized == '\0') {
    lVar1 = (long)xmlInputCallbackNr;
    if (lVar1 < 0xf) {
      xmlInputCallbackTable[lVar1].matchcallback = xmlFileMatch;
      xmlInputCallbackTable[lVar1].opencallback = xmlFileOpen;
      xmlInputCallbackTable[lVar1].readcallback = xmlFileRead;
      xmlInputCallbackTable[lVar1].closecallback = xmlFileClose;
      xmlInputCallbackNr = xmlInputCallbackNr + 1;
    }
    lVar1 = (long)xmlInputCallbackNr;
    if (lVar1 < 0xf) {
      xmlInputCallbackTable[lVar1].matchcallback = xmlGzfileMatch;
      xmlInputCallbackTable[lVar1].opencallback = xmlGzfileOpen;
      xmlInputCallbackTable[lVar1].readcallback = xmlGzfileRead;
      xmlInputCallbackTable[lVar1].closecallback = xmlGzfileClose;
      xmlInputCallbackNr = xmlInputCallbackNr + 1;
    }
    lVar1 = (long)xmlInputCallbackNr;
    if (lVar1 < 0xf) {
      xmlInputCallbackTable[lVar1].matchcallback = xmlXzfileMatch;
      xmlInputCallbackTable[lVar1].opencallback = xmlXzfileOpen;
      xmlInputCallbackTable[lVar1].readcallback = xmlXzfileRead;
      xmlInputCallbackTable[lVar1].closecallback = xmlXzfileClose;
      xmlInputCallbackNr = xmlInputCallbackNr + 1;
    }
    lVar1 = (long)xmlInputCallbackNr;
    if (lVar1 < 0xf) {
      xmlInputCallbackTable[lVar1].matchcallback = xmlIOHTTPMatch;
      xmlInputCallbackTable[lVar1].opencallback = xmlIOHTTPOpen;
      xmlInputCallbackTable[lVar1].readcallback = xmlIOHTTPRead;
      xmlInputCallbackTable[lVar1].closecallback = xmlIOHTTPClose;
      xmlInputCallbackNr = xmlInputCallbackNr + 1;
    }
    xmlInputCallbackInitialized = '\x01';
  }
  return;
}

Assistant:

void
xmlRegisterDefaultInputCallbacks(void) {
    if (xmlInputCallbackInitialized)
	return;

    xmlRegisterInputCallbacks(xmlFileMatch, xmlFileOpen,
	                      xmlFileRead, xmlFileClose);
#ifdef LIBXML_ZLIB_ENABLED
    xmlRegisterInputCallbacks(xmlGzfileMatch, xmlGzfileOpen,
	                      xmlGzfileRead, xmlGzfileClose);
#endif /* LIBXML_ZLIB_ENABLED */
#ifdef LIBXML_LZMA_ENABLED
    xmlRegisterInputCallbacks(xmlXzfileMatch, xmlXzfileOpen,
	                      xmlXzfileRead, xmlXzfileClose);
#endif /* LIBXML_LZMA_ENABLED */

#ifdef LIBXML_HTTP_ENABLED
    xmlRegisterInputCallbacks(xmlIOHTTPMatch, xmlIOHTTPOpen,
	                      xmlIOHTTPRead, xmlIOHTTPClose);
#endif /* LIBXML_HTTP_ENABLED */

#ifdef LIBXML_FTP_ENABLED
    xmlRegisterInputCallbacks(xmlIOFTPMatch, xmlIOFTPOpen,
	                      xmlIOFTPRead, xmlIOFTPClose);
#endif /* LIBXML_FTP_ENABLED */
    xmlInputCallbackInitialized = 1;
}